

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::ShaderPerformanceMeasurer
          (ShaderPerformanceMeasurer *this,RenderContext *renderCtx,PerfCaseType measureType)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_44;
  int local_34;
  PerfCaseType measureType_local;
  RenderContext *renderCtx_local;
  ShaderPerformanceMeasurer *this_local;
  
  this->m_renderCtx = renderCtx;
  iVar1 = 0xff;
  if (measureType == CASETYPE_FRAGMENT) {
    iVar1 = 1;
  }
  this->m_gridSizeX = iVar1;
  iVar1 = 0xff;
  if (measureType == CASETYPE_FRAGMENT) {
    iVar1 = 1;
  }
  this->m_gridSizeY = iVar1;
  if (measureType == CASETYPE_VERTEX) {
    local_34 = 0x20;
  }
  else {
    iVar1 = (*renderCtx->_vptr_RenderContext[4])();
    local_34 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  }
  this->m_viewportWidth = local_34;
  if (measureType == CASETYPE_VERTEX) {
    local_44 = 0x20;
  }
  else {
    iVar1 = (*renderCtx->_vptr_RenderContext[4])();
    local_44 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  }
  this->m_viewportHeight = local_44;
  this->m_state = STATE_UNINITIALIZED;
  Result::Result(&this->m_result,-1.0,-1.0);
  TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  this->m_indexBuffer = 0;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&this->m_attributes);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_attribBuffers);
  this->m_vao = 0;
  return;
}

Assistant:

ShaderPerformanceMeasurer::ShaderPerformanceMeasurer (const glu::RenderContext& renderCtx, PerfCaseType measureType)
	: m_renderCtx		(renderCtx)
	, m_gridSizeX		(measureType == CASETYPE_FRAGMENT	? 1		: 255)
	, m_gridSizeY		(measureType == CASETYPE_FRAGMENT	? 1		: 255)
	, m_viewportWidth	(measureType == CASETYPE_VERTEX		? 32	: renderCtx.getRenderTarget().getWidth())
	, m_viewportHeight	(measureType == CASETYPE_VERTEX		? 32	: renderCtx.getRenderTarget().getHeight())
	, m_state			(STATE_UNINITIALIZED)
	, m_result			(-1.0f, -1.0f)
	, m_indexBuffer		(0)
	, m_vao				(0)
{
}